

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  uint uVar1;
  color_quad_u8 *pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  color_quad<unsigned_char,_int> *local_d8;
  bool local_c5;
  bool success;
  uint sorted_pixel_index_1;
  uint sorted_pixel_index;
  uint y;
  uint c_2;
  uint cur_selector;
  uint c_1;
  uint min_error_1;
  uint c;
  uint min_error;
  color_quad_u8 *pSrc_pixels;
  uint64 total_error;
  uint block_inten_midpoints [3];
  color_quad_u8 block_color;
  int yd;
  uint s;
  color_quad_u8 block_colors [4];
  uint block_inten [4];
  int *pInten_table;
  int inten_table;
  uint n;
  color_quad_u8 base_color;
  int db;
  int dg;
  int dr;
  potential_solution *pBest_solution_local;
  potential_solution *trial_solution_local;
  etc1_solution_coordinates *coords_local;
  etc1_optimizer *this_local;
  
  if ((this->m_pParams->m_constrain_against_base_color5 & 1U) != 0) {
    iVar3 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(this->m_pParams->m_base_color5).field_0.field_0.r;
    base_color.field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         ((uint)(coords->m_unscaled_color).field_0.field_0.g -
         (uint)(this->m_pParams->m_base_color5).field_0.field_0.g);
    n = (uint)(coords->m_unscaled_color).field_0.field_0.b -
        (uint)(this->m_pParams->m_base_color5).field_0.field_0.b;
    iVar4 = math::minimum<int>(iVar3,(int)base_color.field_0,n);
    if ((iVar4 < -4) || (iVar3 = math::maximum<int>(iVar3,(int)base_color.field_0,n), 3 < iVar3)) {
      trial_solution->m_valid = false;
      return false;
    }
  }
  etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&inten_table);
  uVar1 = this->m_pParams->m_num_src_pixels;
  trial_solution->m_error = 0xffffffffffffffff;
  for (pInten_table._0_4_ = 7; -1 < (int)(uint)pInten_table;
      pInten_table._0_4_ = (uint)pInten_table - 1) {
    local_d8 = (color_quad<unsigned_char,_int> *)&yd;
    do {
      color_quad<unsigned_char,_int>::color_quad(local_d8);
      local_d8 = local_d8 + 1;
    } while (local_d8 != block_colors + 2);
    for (block_color.field_0 =
              (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
              (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
               )0x0; (uint)block_color.field_0 < 4;
        block_color.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             ((int)block_color.field_0 + 1)) {
      block_inten_midpoints[2] =
           *(uint *)(g_etc1_inten_tables +
                    (ulong)(uint)block_color.field_0 * 4 + (long)(int)(uint)pInten_table * 0x10);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)(block_inten_midpoints + 1),
                 (byte)inten_table + block_inten_midpoints[2],
                 inten_table._1_1_ + block_inten_midpoints[2],
                 inten_table._2_1_ + block_inten_midpoints[2],0);
      color_quad<unsigned_char,_int>::operator=
                ((color_quad<unsigned_char,_int> *)(&yd + (uint)block_color.field_0),
                 (color_quad<unsigned_char,_int> *)(block_inten_midpoints + 1));
      block_colors[(ulong)(uint)block_color.field_0 + 2].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           ((uint)(byte)block_inten_midpoints[1] + (uint)block_inten_midpoints[1]._1_1_ +
           (uint)block_inten_midpoints[1]._2_1_);
    }
    block_inten_midpoints[0] = block_inten[0] + block_inten[1];
    pSrc_pixels = (color_quad_u8 *)0x0;
    pcVar2 = this->m_pParams->m_pSrc_pixels;
    if (this->m_pSorted_luma[uVar1 - 1] << 1 <
        (uint)((int)block_colors[2].field_0 + (int)block_colors[3].field_0)) {
      if (((uint)block_colors[2].field_0 <=
           ((anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
           (this->m_pSorted_luma + (uVar1 - 1)))->m_u32) ||
         ((ulong)((int)block_colors[2].field_0 - this->m_pSorted_luma[uVar1 - 1]) <
          trial_solution->m_error)) {
        puVar6 = vector<unsigned_char>::operator[](&this->m_temp_selectors,0);
        memset(puVar6,0,(ulong)uVar1);
        for (c_1 = 0; c_1 < uVar1; c_1 = c_1 + 1) {
          uVar5 = crnlib::color::elucidian_distance((color_quad_u8 *)&yd,pcVar2 + c_1,false);
          pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + (ulong)uVar5);
        }
        goto LAB_002021d6;
      }
    }
    else {
      if (*this->m_pSorted_luma << 1 < block_inten[0] + block_inten[1]) {
        y = 0;
        for (sorted_pixel_index = 0; sorted_pixel_index < uVar1;
            sorted_pixel_index = sorted_pixel_index + 1) {
          while (block_inten_midpoints[(ulong)y - 2] <=
                 this->m_pSorted_luma[sorted_pixel_index] << 1) {
            y = y + 1;
            if (2 < y) goto LAB_00202154;
          }
          uVar5 = this->m_pSorted_luma_indices[sorted_pixel_index];
          puVar6 = vector<unsigned_char>::operator[](&this->m_temp_selectors,uVar5);
          *puVar6 = (uchar)y;
          uVar5 = crnlib::color::elucidian_distance((color_quad_u8 *)(&yd + y),pcVar2 + uVar5,false)
          ;
          pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + (ulong)uVar5);
        }
LAB_00202154:
        for (; sorted_pixel_index < uVar1; sorted_pixel_index = sorted_pixel_index + 1) {
          uVar5 = this->m_pSorted_luma_indices[sorted_pixel_index];
          puVar6 = vector<unsigned_char>::operator[](&this->m_temp_selectors,uVar5);
          *puVar6 = '\x03';
          uVar5 = crnlib::color::elucidian_distance(block_colors + 1,pcVar2 + uVar5,false);
          pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + (ulong)uVar5);
        }
      }
      else {
        if ((block_inten[1] < *this->m_pSorted_luma) &&
           (trial_solution->m_error <= (ulong)(*this->m_pSorted_luma - block_inten[1])))
        goto LAB_00202233;
        puVar6 = vector<unsigned_char>::operator[](&this->m_temp_selectors,0);
        memset(puVar6,3,(ulong)uVar1);
        for (c_2 = 0; c_2 < uVar1; c_2 = c_2 + 1) {
          uVar5 = crnlib::color::elucidian_distance(block_colors + 1,pcVar2 + c_2,false);
          pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + (ulong)uVar5);
        }
      }
LAB_002021d6:
      if (pSrc_pixels < (color_quad_u8 *)trial_solution->m_error) {
        trial_solution->m_error = (uint64)pSrc_pixels;
        (trial_solution->m_coords).m_inten_table = (uint)pInten_table;
        vector<unsigned_char>::swap(&trial_solution->m_selectors,&this->m_temp_selectors);
        trial_solution->m_valid = true;
        if (pSrc_pixels == (color_quad_u8 *)0x0) break;
      }
    }
LAB_00202233:
  }
  color_quad<unsigned_char,_int>::operator=
            ((color_quad<unsigned_char,_int> *)trial_solution,&coords->m_unscaled_color);
  (trial_solution->m_coords).m_color4 = (bool)(this->m_pParams->m_use_color4 & 1);
  local_c5 = false;
  if ((pBest_solution != (potential_solution *)0x0) &&
     (local_c5 = trial_solution->m_error < pBest_solution->m_error, local_c5)) {
    potential_solution::operator=(pBest_solution,trial_solution);
  }
  return local_c5;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
    {
        if (m_pParams->m_constrain_against_base_color5)
        {
            const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
            const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
            const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                trial_solution.m_valid = false;
                return false;
            }
        }

        const color_quad_u8 base_color(coords.get_scaled_color());

        const uint n = m_pParams->m_num_src_pixels;
        CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

        trial_solution.m_error = cUINT64_MAX;

        for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
        {
            const int* pInten_table = g_etc1_inten_tables[inten_table];

            uint block_inten[4];
            color_quad_u8 block_colors[4];
            for (uint s = 0; s < 4; s++)
            {
                const int yd = pInten_table[s];
                color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
                block_colors[s] = block_color;
                block_inten[s] = block_color.r + block_color.g + block_color.b;
            }

            // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
            // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
            // 0   1   2   3
            //   01  12  23
            const uint block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };

            uint64 total_error = 0;
            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
            {
                if (block_inten[0] > m_pSorted_luma[n - 1])
                {
                    const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 0, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[0], pSrc_pixels[c], false);
                }
            }
            else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
            {
                if (m_pSorted_luma[0] > block_inten[3])
                {
                    const uint min_error = m_pSorted_luma[0] - block_inten[3];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 3, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[c], false);
                }
            }
            else
            {
                uint cur_selector = 0, c;
                for (c = 0; c < n; c++)
                {
                    const uint y = m_pSorted_luma[c];
                    while ((y * 2) >= block_inten_midpoints[cur_selector])
                    {
                        if (++cur_selector > 2)
                        {
                            goto done;
                        }
                    }
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
                    total_error += color::elucidian_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
                }
            done:
                while (c < n)
                {
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = 3;
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
                    ++c;
                }
            }

            if (total_error < trial_solution.m_error)
            {
                trial_solution.m_error = total_error;
                trial_solution.m_coords.m_inten_table = inten_table;
                trial_solution.m_selectors.swap(m_temp_selectors);
                trial_solution.m_valid = true;
                if (!total_error)
                {
                    break;
                }
            }
        }
        trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
        trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

        bool success = false;
        if (pBest_solution)
        {
            if (trial_solution.m_error < pBest_solution->m_error)
            {
                *pBest_solution = trial_solution;
                success = true;
            }
        }

        return success;
    }